

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O0

void absl::lts_20250127::internal_any_invocable::
     RemoteInvoker<false,void,google::protobuf::compiler::cpp::(anonymous_namespace)::AccessorVerifier&,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::SourceLocation>
               (TypeErasedState *state,ForwardedParameterType<std::basic_string_view<char>_> args,
               ForwardedParameterType<google::protobuf::io::Printer::SourceLocation> args_1)

{
  RawT *f;
  ForwardedParameterType<google::protobuf::io::Printer::SourceLocation> args_local_1;
  ForwardedParameterType<std::basic_string_view<char>_> args_local;
  TypeErasedState *state_local;
  
  InvokeR<void,google::protobuf::compiler::cpp::(anonymous_namespace)::AccessorVerifier&,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::SourceLocation,void>
            ((AccessorVerifier *)(state->remote).target,args,args_1);
  return;
}

Assistant:

ReturnType RemoteInvoker(
    TypeErasedState* const state,
    ForwardedParameterType<P>... args) noexcept(SigIsNoexcept) {
  using RawT = RemoveCVRef<QualTRef>;
  static_assert(!IsStoredLocally<RawT>::value,
                "Target object must be in remote storage in order to be "
                "invoked from it.");

  auto& f = *static_cast<RawT*>(state->remote.target);
  return (InvokeR<ReturnType>)(static_cast<QualTRef>(f),
                               static_cast<ForwardedParameterType<P>>(args)...);
}